

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tnt_array2d.h
# Opt level: O0

int __thiscall TNT::Array2D<double>::copy(Array2D<double> *this,EVP_PKEY_CTX *dst,EVP_PKEY_CTX *src)

{
  double dVar1;
  double **ppdVar2;
  double *pdVar3;
  int local_24;
  int local_20;
  int j;
  int i;
  Array2D<double> *this_local;
  Array2D<double> *A;
  
  Array2D(this,*(int *)(dst + 0x40),*(int *)(dst + 0x44));
  for (local_20 = 0; local_20 < *(int *)(dst + 0x40); local_20 = local_20 + 1) {
    for (local_24 = 0; local_24 < *(int *)(dst + 0x44); local_24 = local_24 + 1) {
      ppdVar2 = Array1D<double_*>::operator[]((Array1D<double_*> *)(dst + 0x20),local_20);
      dVar1 = (*ppdVar2)[local_24];
      pdVar3 = operator[](this,local_20);
      pdVar3[local_24] = dVar1;
    }
  }
  return (int)this;
}

Assistant:

Array2D<T> Array2D<T>::copy() const
{
	Array2D A(m_, n_);

	for (int i=0; i<m_; i++)
		for (int j=0; j<n_; j++)
			A[i][j] = v_[i][j];


	return A;
}